

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void __thiscall CVmUTF8Source::~CVmUTF8Source(CVmUTF8Source *this)

{
  void *in_RDI;
  
  ~CVmUTF8Source((CVmUTF8Source *)0x344088);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

CVmUTF8Source(const char *str, size_t len)
    {
        /* remember the string and its byte length */
        this->str = str;
        this->bytelen = len;

        /* calculate the character length */
        utf8_ptr p((char *)str);
        this->charlen = p.len(len);

        /* start at the beginning of the string */
        this->charidx = 0;
        this->byteidx = 0;
    }